

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O0

int Spl_ManFindGoodCand(Spl_Man_t *p)

{
  int iVar1;
  int iVar2;
  int local_24;
  int InCountMax;
  int InCount;
  int Res;
  int iObj;
  int i;
  Spl_Man_t *p_local;
  
  InCountMax = 0;
  local_24 = -1;
  for (Res = 0; iVar1 = Vec_IntSize(p->vInputs), Res < iVar1; Res = Res + 1) {
    iVar1 = Vec_IntEntry(p->vInputs,Res);
    Vec_BitWriteEntry(p->vMarksIn,iVar1,1);
  }
  for (Res = 0; iVar1 = Vec_IntSize(p->vCands), Res < iVar1; Res = Res + 1) {
    iVar1 = Vec_IntEntry(p->vCands,Res);
    iVar2 = Spl_ManCountMarkedFanins(p->pGia,iVar1,p->vMarksIn);
    if (local_24 < iVar2) {
      local_24 = iVar2;
      InCountMax = iVar1;
    }
  }
  for (Res = 0; iVar1 = Vec_IntSize(p->vInputs), Res < iVar1; Res = Res + 1) {
    iVar1 = Vec_IntEntry(p->vInputs,Res);
    Vec_BitWriteEntry(p->vMarksIn,iVar1,0);
  }
  return InCountMax;
}

Assistant:

int Spl_ManFindGoodCand( Spl_Man_t * p )
{
    int i, iObj;
    int Res = 0, InCount, InCountMax = -1; 
    // mark leaves
    Vec_IntForEachEntry( p->vInputs, iObj, i )
        Vec_BitWriteEntry( p->vMarksIn, iObj, 1 );
    // find candidate with maximum input overlap
    Vec_IntForEachEntry( p->vCands, iObj, i )
    {
        InCount = Spl_ManCountMarkedFanins( p->pGia, iObj, p->vMarksIn );
        if ( InCountMax < InCount )
        {
            InCountMax = InCount;
            Res = iObj;
        }
    }
    // unmark leaves
    Vec_IntForEachEntry( p->vInputs, iObj, i )
        Vec_BitWriteEntry( p->vMarksIn, iObj, 0 );
    return Res;
}